

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DB.cpp
# Opt level: O0

bool __thiscall DB::execSql(DB *this,string *sql)

{
  MYSQL *pMVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  undefined8 uVar5;
  ostream *poVar6;
  char *pcVar7;
  MYSQL_RES *pMVar8;
  MYSQL_ROW ppcVar9;
  uint local_30;
  uint local_2c;
  int j;
  int i;
  uint num_rows;
  uint num_fields;
  string *sql_local;
  DB *this_local;
  
  pMVar1 = this->mysql;
  uVar5 = std::__cxx11::string::c_str();
  iVar2 = mysql_query(pMVar1,uVar5);
  if (iVar2 == 0) {
    pMVar8 = (MYSQL_RES *)mysql_use_result(this->mysql);
    this->result = pMVar8;
    if (this->result != (MYSQL_RES *)0x0) {
      uVar3 = mysql_num_fields(this->result);
      uVar4 = mysql_num_rows(this->mysql);
      for (local_2c = 0; local_2c < uVar4; local_2c = local_2c + 1) {
        ppcVar9 = (MYSQL_ROW)mysql_fetch_row(this->result);
        this->row = ppcVar9;
        if (this->row == (MYSQL_ROW)0x0) break;
        for (local_30 = 0; local_30 < uVar3; local_30 = local_30 + 1) {
          poVar6 = std::operator<<((ostream *)&std::cout,this->row[(int)local_30]);
          std::operator<<(poVar6,"\t");
        }
        std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      }
    }
    mysql_free_result(this->result);
    this_local._7_1_ = true;
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cout,"query error ");
    pcVar7 = (char *)mysql_error(this->mysql);
    poVar6 = std::operator<<(poVar6,pcVar7);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DB::execSql(string sql) {
    if (mysql_query(mysql, sql.c_str())) {
        cout << "query error " << mysql_error(mysql) << endl;
        return false;
    } else {
        result = mysql_use_result(mysql);
        if (result) {
            unsigned int num_fields = mysql_num_fields(result);
            unsigned int num_rows = mysql_num_rows(reinterpret_cast<MYSQL_RES *>(mysql));
            for (int i = 0; i < num_rows; i++) {
                row = mysql_fetch_row(result);
                if (!row) break;
                for (int j = 0; j < num_fields; j++) {
                    cout << row[j] << "\t";
                }
                cout << endl;
            }
        }
        mysql_free_result(result);
    }
    return true;
}